

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

ssize_t __thiscall
Dashel::FileDescriptorStream::read(FileDescriptorStream *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t *psVar1;
  size_t sVar2;
  _func_int *p_Var3;
  int iVar4;
  void *in_RAX;
  undefined4 extraout_var;
  int *piVar5;
  undefined4 in_register_00000034;
  void *__n;
  void *__dest;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x33d,"virtual void Dashel::FileDescriptorStream::read(void *, size_t)");
  }
  if (__buf != (void *)0x0) {
    iVar4 = (*(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[3])()
    ;
    in_RAX = (void *)CONCAT44(extraout_var,iVar4);
    if ((char)iVar4 != '\0') {
      sVar2 = (this->super_DisconnectableStream).recvBufferPos;
      __n = (void *)((this->super_DisconnectableStream).recvBufferSize - sVar2);
      if (__buf <= __n) {
        __n = __buf;
      }
      in_RAX = memcpy(__dest,&(this->super_DisconnectableStream).super_SelectableStream.field_0x10 +
                             sVar2,(size_t)__n);
      psVar1 = &(this->super_DisconnectableStream).recvBufferPos;
      *psVar1 = *psVar1 + (long)__n;
      __dest = (void *)((long)__dest + (long)__n);
      __buf = (void *)((long)__buf - (long)__n);
    }
    for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - (long)in_RAX)) {
      in_RAX = (void *)::read((this->super_DisconnectableStream).super_SelectableStream.fd,__dest,
                              (size_t)__buf);
      if ((long)in_RAX < 0) {
        p_Var3 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream
                 [-3];
        piVar5 = __errno_location();
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream + (long)p_Var3),IOError,*piVar5,
                     "File read I/O error.");
      }
      if (in_RAX == (void *)0x0) {
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),ConnectionLost,0,"Reached end of file.");
      }
      __dest = (void *)((long)__dest + (long)in_RAX);
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

virtual void read(void* data, size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

			char* ptr = (char*)data;
			size_t left = size;

			if (isDataInRecvBuffer())
			{
				size_t toCopy = std::min(recvBufferSize - recvBufferPos, size);
				memcpy(ptr, recvBuffer + recvBufferPos, toCopy);
				recvBufferPos += toCopy;
				ptr += toCopy;
				left -= toCopy;
			}

			while (left)
			{
				ssize_t len = ::read(fd, ptr, left);

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "File read I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "Reached end of file.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}